

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O2

int Saig_ManHideBadRegs(Aig_Man_t *p,Vec_Ptr_t *vBadRegs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  void *Entry;
  int iVar5;
  int i;
  int i_00;
  int iVar6;
  int i_01;
  
  if (vBadRegs->nSize == 0) {
    iVar5 = 0;
  }
  else {
    for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
      pAVar3 = Saig_ManLi(p,iVar5);
      pAVar4 = Saig_ManLo(p,iVar5);
      (pAVar3->field_5).pData = pAVar4;
    }
    p_00 = Vec_PtrDup(p->vCis);
    p_01 = Vec_PtrDup(p->vCos);
    iVar5 = p->nObjs[2] - p->nRegs;
    if (iVar5 != p->nTruePis) {
      __assert_fail("nTruePi == p->nTruePis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigRetMin.c"
                    ,0x1fa,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    iVar6 = p->nObjs[3] - p->nRegs;
    if (iVar6 != p->nTruePos) {
      __assert_fail("nTruePo == p->nTruePos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigRetMin.c"
                    ,0x1fb,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    i_01 = 0;
    while( true ) {
      i = iVar5 + i_01;
      i_00 = iVar6 + i_01;
      if (vBadRegs->nSize <= i_01) break;
      Entry = Vec_PtrEntry(vBadRegs,i_01);
      Vec_PtrWriteEntry(p_00,i,*(void **)((long)Entry + 0x28));
      Vec_PtrWriteEntry(p_01,i_00,Entry);
      *(byte *)((long)Entry + 0x18) = *(byte *)((long)Entry + 0x18) | 0x10;
      i_01 = i_01 + 1;
    }
    for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
      pAVar3 = Saig_ManLi(p,iVar5);
      pAVar4 = Saig_ManLo(p,iVar5);
      if ((*(ulong *)&pAVar3->field_0x18 & 0x10) == 0) {
        Vec_PtrWriteEntry(p_00,i,pAVar4);
        Vec_PtrWriteEntry(p_01,i_00,pAVar3);
        i = i + 1;
        i_00 = i_00 + 1;
      }
      else {
        *(ulong *)&pAVar3->field_0x18 = *(ulong *)&pAVar3->field_0x18 & 0xffffffffffffffef;
      }
    }
    if (i != p->nObjs[2]) {
      __assert_fail("nTruePi == Aig_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigRetMin.c"
                    ,0x20d,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    if (i_00 != p->nObjs[3]) {
      __assert_fail("nTruePo == Aig_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigRetMin.c"
                    ,0x20e,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    Vec_PtrFree(p->vCis);
    p->vCis = p_00;
    Vec_PtrFree(p->vCos);
    p->vCos = p_01;
    iVar5 = vBadRegs->nSize;
    p->nRegs = p->nRegs - iVar5;
    uVar1 = p->nTruePis;
    uVar2 = p->nTruePos;
    p->nTruePis = iVar5 + uVar1;
    p->nTruePos = iVar5 + uVar2;
  }
  return iVar5;
}

Assistant:

int Saig_ManHideBadRegs( Aig_Man_t * p, Vec_Ptr_t * vBadRegs )
{
    Vec_Ptr_t * vPisNew, * vPosNew;
    Aig_Obj_t * pObjLi, * pObjLo;
    int nTruePi, nTruePo, nBadRegs, i;
    if ( Vec_PtrSize(vBadRegs) == 0 )
        return 0;
    // attached LOs to LIs
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        pObjLi->pData = pObjLo;
    // reorder them by putting bad registers first
    vPisNew = Vec_PtrDup( p->vCis );
    vPosNew = Vec_PtrDup( p->vCos );
    nTruePi = Aig_ManCiNum(p) - Aig_ManRegNum(p);
    nTruePo = Aig_ManCoNum(p) - Aig_ManRegNum(p);
    assert( nTruePi == p->nTruePis );
    assert( nTruePo == p->nTruePos );
    Vec_PtrForEachEntry( Aig_Obj_t *, vBadRegs, pObjLi, i )
    {
        Vec_PtrWriteEntry( vPisNew, nTruePi++, pObjLi->pData );
        Vec_PtrWriteEntry( vPosNew, nTruePo++, pObjLi );
        pObjLi->fMarkA = 1;
    }
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
    {
        if ( pObjLi->fMarkA )
        {
            pObjLi->fMarkA = 0;
            continue;
        }
        Vec_PtrWriteEntry( vPisNew, nTruePi++, pObjLo );
        Vec_PtrWriteEntry( vPosNew, nTruePo++, pObjLi );
    }
    // check the sizes
    assert( nTruePi == Aig_ManCiNum(p) );
    assert( nTruePo == Aig_ManCoNum(p) );
    // transfer the arrays
    Vec_PtrFree( p->vCis ); p->vCis = vPisNew;
    Vec_PtrFree( p->vCos ); p->vCos = vPosNew;
    // update the PIs
    nBadRegs = Vec_PtrSize(vBadRegs);
    p->nRegs -= nBadRegs;
    p->nTruePis += nBadRegs;
    p->nTruePos += nBadRegs;
    return nBadRegs;
}